

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicslayoutitem.cpp
# Opt level: O0

QRectF * __thiscall QGraphicsLayoutItem::contentsRect(QGraphicsLayoutItem *this)

{
  QRectF *in_RSI;
  QRectF *in_RDI;
  long in_FS_OFFSET;
  qreal bottom;
  qreal right;
  qreal top;
  qreal left;
  QRectF *this_00;
  QPointF *this_01;
  QRectF *this_02;
  QRectF local_88;
  QSizeF local_68;
  QPointF local_58 [3];
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = 0xffffffffffffffff;
  local_18 = 0xffffffffffffffff;
  local_20 = 0xffffffffffffffff;
  local_28 = 0xffffffffffffffff;
  this_02 = in_RDI;
  (**(code **)((long)in_RSI->xp + 0x18))(in_RSI,&local_10,&local_18,&local_20,&local_28);
  this_01 = local_58;
  QPointF::QPointF(this_01);
  this_00 = &local_88;
  geometry((QGraphicsLayoutItem *)this_00);
  local_68 = QRectF::size(in_RSI);
  QRectF::QRectF(this_00,(QPointF *)in_RSI,(QSizeF *)in_RDI);
  QRectF::adjusted(this_02,(qreal)this_01,(qreal)this_00,(qreal)in_RSI,(qreal)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QRectF QGraphicsLayoutItem::contentsRect() const
{
    qreal left, top, right, bottom;
    getContentsMargins(&left, &top, &right, &bottom);
    return QRectF(QPointF(), geometry().size()).adjusted(+left, +top, -right, -bottom);
}